

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_updateDUBT(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  undefined4 *puVar7;
  undefined4 in_ECX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  U32 *sortMarkPtr;
  U32 *nextCandidatePtr;
  U32 matchIndex;
  size_t h;
  U32 idx;
  U32 target;
  BYTE *base;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  U32 hashLog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  undefined4 *in_stack_ffffffffffffff70;
  uint local_70;
  size_t local_8;
  
  lVar4 = *(long *)(in_RDI + 0x70);
  uVar1 = *(uint *)(in_RDI + 0x108);
  lVar5 = *(long *)(in_RDI + 0x80);
  uVar2 = *(undefined4 *)(in_RDI + 0x104);
  uVar6 = (int)in_RSI - (int)*(undefined8 *)(in_RDI + 8);
  local_70 = *(uint *)(in_RDI + 0x2c);
  if (in_RDX < in_RSI + 8U) {
    __assert_fail("ip + 8 <= iend",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x739e,
                  "void ZSTD_updateDUBT(ZSTD_matchState_t *, const BYTE *, const BYTE *, U32)");
  }
  if (*(uint *)(in_RDI + 0x18) <= local_70) {
    while( true ) {
      if (uVar6 <= local_70) {
        *(uint *)(in_RDI + 0x2c) = uVar6;
        return;
      }
      if (0x20 < uVar1) break;
      switch(in_ECX) {
      default:
        local_8 = ZSTD_hash4Ptr(in_stack_ffffffffffffff70,0);
        break;
      case 5:
        local_8 = ZSTD_hash5Ptr(in_stack_ffffffffffffff70,0);
        break;
      case 6:
        local_8 = ZSTD_hash6Ptr(in_stack_ffffffffffffff70,0);
        break;
      case 7:
        local_8 = ZSTD_hash7Ptr(in_stack_ffffffffffffff70,0);
        break;
      case 8:
        local_8 = ZSTD_hash8Ptr(in_stack_ffffffffffffff70,0);
      }
      uVar3 = *(undefined4 *)(lVar4 + local_8 * 4);
      puVar7 = (undefined4 *)
               (lVar5 + (ulong)((local_70 & (1 << ((char)uVar2 - 1U & 0x1f)) - 1U) << 1) * 4);
      in_stack_ffffffffffffff70 = puVar7 + 1;
      *(uint *)(lVar4 + local_8 * 4) = local_70;
      *puVar7 = uVar3;
      *in_stack_ffffffffffffff70 = 1;
      local_70 = local_70 + 1;
    }
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  __assert_fail("idx >= ms->window.dictLimit",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x73a1,"void ZSTD_updateDUBT(ZSTD_matchState_t *, const BYTE *, const BYTE *, U32)"
               );
}

Assistant:

static void
ZSTD_updateDUBT(ZSTD_matchState_t* ms,
                const BYTE* ip, const BYTE* iend,
                U32 mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32  const hashLog = cParams->hashLog;

    U32* const bt = ms->chainTable;
    U32  const btLog  = cParams->chainLog - 1;
    U32  const btMask = (1 << btLog) - 1;

    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32 idx = ms->nextToUpdate;

    if (idx != target)
        DEBUGLOG(7, "ZSTD_updateDUBT, from %u to %u (dictLimit:%u)",
                    idx, target, ms->window.dictLimit);
    assert(ip + 8 <= iend);   /* condition for ZSTD_hashPtr */
    (void)iend;

    assert(idx >= ms->window.dictLimit);   /* condition for valid base+idx */
    for ( ; idx < target ; idx++) {
        size_t const h  = ZSTD_hashPtr(base + idx, hashLog, mls);   /* assumption : ip + 8 <= iend */
        U32    const matchIndex = hashTable[h];

        U32*   const nextCandidatePtr = bt + 2*(idx&btMask);
        U32*   const sortMarkPtr  = nextCandidatePtr + 1;

        DEBUGLOG(8, "ZSTD_updateDUBT: insert %u", idx);
        hashTable[h] = idx;   /* Update Hash Table */
        *nextCandidatePtr = matchIndex;   /* update BT like a chain */
        *sortMarkPtr = ZSTD_DUBT_UNSORTED_MARK;
    }
    ms->nextToUpdate = target;
}